

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::V3d::transformVectors(V3d *out,V3d *in,int32 n,Matrix *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  V3d *pVVar13;
  V3d tmp;
  int32 i;
  Matrix *m_local;
  int32 n_local;
  V3d *in_local;
  V3d *out_local;
  
  for (tmp.y = 0.0; (int)tmp.y < n; tmp.y = (float32)((int)tmp.y + 1)) {
    fVar1 = (float)in[(int)tmp.y].x;
    fVar2 = (float)(m->right).y;
    fVar3 = (float)in[(int)tmp.y].y;
    fVar4 = (float)(m->up).y;
    fVar5 = (float)in[(int)tmp.y].z;
    fVar6 = (float)(m->at).y;
    fVar7 = (float)in[(int)tmp.y].x;
    fVar8 = (float)(m->right).z;
    fVar9 = (float)in[(int)tmp.y].y;
    fVar10 = (float)(m->up).z;
    fVar11 = (float)in[(int)tmp.y].z;
    fVar12 = (float)(m->at).z;
    pVVar13 = out + (int)tmp.y;
    pVVar13->x = (float32)((float)in[(int)tmp.y].z * (float)(m->at).x +
                          (float)in[(int)tmp.y].x * (float)(m->right).x +
                          (float)in[(int)tmp.y].y * (float)(m->up).x);
    pVVar13->y = (float32)(fVar5 * fVar6 + fVar1 * fVar2 + fVar3 * fVar4);
    pVVar13->z = (float32)(fVar11 * fVar12 + fVar7 * fVar8 + fVar9 * fVar10);
  }
  return;
}

Assistant:

void
V3d::transformVectors(V3d *out, const V3d *in, int32 n, const Matrix *m)
{
	int32 i;
	V3d tmp;
	for(i = 0; i < n; i++){
		tmp.x = in[i].x*m->right.x + in[i].y*m->up.x + in[i].z*m->at.x;
		tmp.y = in[i].x*m->right.y + in[i].y*m->up.y + in[i].z*m->at.y;
		tmp.z = in[i].x*m->right.z + in[i].y*m->up.z + in[i].z*m->at.z;
		out[i] = tmp;
	}
}